

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotest.cpp
# Opt level: O0

void Test::showFinalResult(void)

{
  ostream *poVar1;
  
  if (failedNum == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"All ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,totalNum);
    poVar1 = std::operator<<(poVar1," tests passed!");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"Failed in ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,failedNum);
    poVar1 = std::operator<<(poVar1," out of ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,totalNum);
    poVar1 = std::operator<<(poVar1," tests!");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Test::showFinalResult() {
    if (!failedNum) {
        std::cout << "All " << totalNum << " tests passed!" << std::endl;
    } else {
        std::cout << "Failed in " << failedNum << " out of " << totalNum << " tests!" << std::endl;
    }
}